

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebur128.c
# Opt level: O0

int ebur128_set_max_history(ebur128_state *st,unsigned_long history)

{
  ebur128_dq_entry *peVar1;
  ebur128_dq_entry *peVar2;
  ebur128_dq_entry *block_1;
  ebur128_dq_entry *block;
  unsigned_long history_local;
  ebur128_state *st_local;
  
  if (((st->mode & 0xbU) == 0xb) && (history < 3000)) {
    block = (ebur128_dq_entry *)0xbb8;
  }
  else {
    block = (ebur128_dq_entry *)history;
    if (((st->mode & 1U) == 1) && (history < 400)) {
      block = (ebur128_dq_entry *)0x190;
    }
  }
  if (block == (ebur128_dq_entry *)st->d->history) {
    st_local._4_4_ = 4;
  }
  else {
    st->d->history = (unsigned_long)block;
    st->d->block_list_max = st->d->history / 100;
    st->d->st_block_list_max = st->d->history / 3000;
    while (st->d->block_list_max < st->d->block_list_size) {
      peVar1 = (st->d->block_list).stqh_first;
      peVar2 = (((st->d->block_list).stqh_first)->entries).stqe_next;
      (st->d->block_list).stqh_first = peVar2;
      if (peVar2 == (ebur128_dq_entry *)0x0) {
        (st->d->block_list).stqh_last = &(st->d->block_list).stqh_first;
      }
      free(peVar1);
      st->d->block_list_size = st->d->block_list_size - 1;
    }
    while (st->d->st_block_list_max < st->d->st_block_list_size) {
      peVar1 = (st->d->short_term_block_list).stqh_first;
      peVar2 = (((st->d->short_term_block_list).stqh_first)->entries).stqe_next;
      (st->d->short_term_block_list).stqh_first = peVar2;
      if (peVar2 == (ebur128_dq_entry *)0x0) {
        (st->d->short_term_block_list).stqh_last = &(st->d->short_term_block_list).stqh_first;
      }
      free(peVar1);
      st->d->st_block_list_size = st->d->st_block_list_size - 1;
    }
    st_local._4_4_ = 0;
  }
  return st_local._4_4_;
}

Assistant:

int ebur128_set_max_history(ebur128_state* st, unsigned long history) {
  if ((st->mode & EBUR128_MODE_LRA) == EBUR128_MODE_LRA && history < 3000) {
    history = 3000;
  } else if ((st->mode & EBUR128_MODE_M) == EBUR128_MODE_M && history < 400) {
    history = 400;
  }
  if (history == st->d->history) {
    return EBUR128_ERROR_NO_CHANGE;
  }
  st->d->history = history;
  st->d->block_list_max = st->d->history / 100;
  st->d->st_block_list_max = st->d->history / 3000;
  while (st->d->block_list_size > st->d->block_list_max) {
    struct ebur128_dq_entry* block = STAILQ_FIRST(&st->d->block_list);
    STAILQ_REMOVE_HEAD(&st->d->block_list, entries);
    free(block);
    st->d->block_list_size--;
  }
  while (st->d->st_block_list_size > st->d->st_block_list_max) {
    struct ebur128_dq_entry* block =
        STAILQ_FIRST(&st->d->short_term_block_list);
    STAILQ_REMOVE_HEAD(&st->d->short_term_block_list, entries);
    free(block);
    st->d->st_block_list_size--;
  }
  return EBUR128_SUCCESS;
}